

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqrt.cc
# Opt level: O0

int BN_sqrt(BIGNUM *out_sqrt,BIGNUM *in,BN_CTX *ctx)

{
  BIGNUM *pBVar1;
  int iVar2;
  uint uVar3;
  BIGNUM *pBVar4;
  BIGNUM *a;
  BN_CTXScope local_60;
  BN_CTXScope scope;
  int last_delta_valid;
  int ok;
  BIGNUM *tmp2;
  BIGNUM *last_delta;
  BIGNUM *delta;
  BIGNUM *tmp;
  BIGNUM *estimate;
  BN_CTX *ctx_local;
  BIGNUM *in_local;
  BIGNUM *out_sqrt_local;
  
  scope.ctx_._4_4_ = 0;
  scope.ctx_._0_4_ = 0;
  if (in->neg == 0) {
    iVar2 = BN_is_zero(in);
    if (iVar2 == 0) {
      bssl::BN_CTXScope::BN_CTXScope(&local_60,ctx);
      tmp = out_sqrt;
      if (out_sqrt == in) {
        tmp = (BIGNUM *)BN_CTX_get((BN_CTX *)ctx);
      }
      pBVar4 = BN_CTX_get((BN_CTX *)ctx);
      tmp2 = (BIGNUM *)BN_CTX_get((BN_CTX *)ctx);
      last_delta = (BIGNUM *)BN_CTX_get((BN_CTX *)ctx);
      if ((((tmp != (BIGNUM *)0x0) && (pBVar4 != (BIGNUM *)0x0)) &&
          ((BIGNUM *)tmp2 != (BIGNUM *)0x0)) && ((BIGNUM *)last_delta != (BIGNUM *)0x0)) {
        a = BN_value_one();
        uVar3 = BN_num_bits((BIGNUM *)in);
        iVar2 = BN_lshift((BIGNUM *)tmp,a,uVar3 >> 1);
        if (iVar2 != 0) {
          while (((pBVar1 = tmp2,
                  iVar2 = BN_div(pBVar4,(BIGNUM *)0x0,(BIGNUM *)in,(BIGNUM *)tmp,(BN_CTX *)ctx),
                  iVar2 != 0 && (iVar2 = BN_add(pBVar4,pBVar4,(BIGNUM *)tmp), iVar2 != 0)) &&
                 ((iVar2 = BN_rshift1((BIGNUM *)tmp,pBVar4), iVar2 != 0 &&
                  ((iVar2 = BN_sqr(pBVar4,(BIGNUM *)tmp,(BN_CTX *)ctx), iVar2 != 0 &&
                   (iVar2 = BN_sub((BIGNUM *)last_delta,(BIGNUM *)in,pBVar4), iVar2 != 0))))))) {
            last_delta->neg = 0;
            if (((int)scope.ctx_ != 0) &&
               (iVar2 = BN_cmp((BIGNUM *)last_delta,(BIGNUM *)tmp2), -1 < iVar2)) {
              iVar2 = BN_cmp(pBVar4,(BIGNUM *)in);
              if (iVar2 == 0) {
                scope.ctx_._4_4_ = 1;
              }
              else {
                ERR_put_error(3,0,0x6e,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bn/sqrt.cc"
                              ,0x52);
              }
              goto LAB_006f4e5a;
            }
            scope.ctx_._0_4_ = 1;
            tmp2 = last_delta;
            last_delta = pBVar1;
          }
          ERR_put_error(3,0,3,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bn/sqrt.cc"
                        ,0x3e);
        }
      }
LAB_006f4e5a:
      if (((scope.ctx_._4_4_ != 0) && (out_sqrt == in)) &&
         (pBVar4 = BN_copy((BIGNUM *)out_sqrt,(BIGNUM *)tmp), pBVar4 == (BIGNUM *)0x0)) {
        scope.ctx_._4_4_ = 0;
      }
      out_sqrt_local._4_4_ = scope.ctx_._4_4_;
      bssl::BN_CTXScope::~BN_CTXScope(&local_60);
    }
    else {
      BN_zero(out_sqrt);
      out_sqrt_local._4_4_ = 1;
    }
  }
  else {
    ERR_put_error(3,0,0x6d,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bn/sqrt.cc"
                  ,0x19);
    out_sqrt_local._4_4_ = 0;
  }
  return out_sqrt_local._4_4_;
}

Assistant:

int BN_sqrt(BIGNUM *out_sqrt, const BIGNUM *in, BN_CTX *ctx) {
  BIGNUM *estimate, *tmp, *delta, *last_delta, *tmp2;
  int ok = 0, last_delta_valid = 0;

  if (in->neg) {
    OPENSSL_PUT_ERROR(BN, BN_R_NEGATIVE_NUMBER);
    return 0;
  }
  if (BN_is_zero(in)) {
    BN_zero(out_sqrt);
    return 1;
  }

  bssl::BN_CTXScope scope(ctx);
  if (out_sqrt == in) {
    estimate = BN_CTX_get(ctx);
  } else {
    estimate = out_sqrt;
  }
  tmp = BN_CTX_get(ctx);
  last_delta = BN_CTX_get(ctx);
  delta = BN_CTX_get(ctx);
  if (estimate == NULL || tmp == NULL || last_delta == NULL || delta == NULL) {
    goto err;
  }

  // We estimate that the square root of an n-bit number is 2^{n/2}.
  if (!BN_lshift(estimate, BN_value_one(), BN_num_bits(in)/2)) {
    goto err;
  }

  // This is Newton's method for finding a root of the equation |estimate|^2 -
  // |in| = 0.
  for (;;) {
    // |estimate| = 1/2 * (|estimate| + |in|/|estimate|)
    if (!BN_div(tmp, NULL, in, estimate, ctx) ||
        !BN_add(tmp, tmp, estimate) ||
        !BN_rshift1(estimate, tmp) ||
        // |tmp| = |estimate|^2
        !BN_sqr(tmp, estimate, ctx) ||
        // |delta| = |in| - |tmp|
        !BN_sub(delta, in, tmp)) {
      OPENSSL_PUT_ERROR(BN, ERR_R_BN_LIB);
      goto err;
    }

    delta->neg = 0;
    // The difference between |in| and |estimate| squared is required to always
    // decrease. This ensures that the loop always terminates, but I don't have
    // a proof that it always finds the square root for a given square.
    if (last_delta_valid && BN_cmp(delta, last_delta) >= 0) {
      break;
    }

    last_delta_valid = 1;

    tmp2 = last_delta;
    last_delta = delta;
    delta = tmp2;
  }

  if (BN_cmp(tmp, in) != 0) {
    OPENSSL_PUT_ERROR(BN, BN_R_NOT_A_SQUARE);
    goto err;
  }

  ok = 1;

err:
  if (ok && out_sqrt == in && !BN_copy(out_sqrt, estimate)) {
    ok = 0;
  }
  return ok;
}